

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind)

{
  bool local_9;
  TokenKind kind_local;
  
  if (((kind == CloseBrace) || (kind == CloseBracket)) ||
     (kind == CloseParenthesis || kind == StarCloseParenthesis)) {
    local_9 = true;
  }
  else {
    local_9 = isEndKeyword(kind);
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind) {
    switch (kind) {
        case TokenKind::CloseBrace:
        case TokenKind::CloseBracket:
        case TokenKind::CloseParenthesis:
        case TokenKind::StarCloseParenthesis:
            return true;
        default:
            return isEndKeyword(kind);
    }
}